

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O2

void __thiscall PythonModuleClient::recv_file_close(PythonModuleClient *this)

{
  bool_type bVar1;
  override recv_file_close;
  PyLockGIL lock;
  object_base local_20;
  PyLockGIL local_14;
  handle<_object> local_10;
  
  local_14.gstate = PyGILState_Ensure();
  boost::python::wrapper<AbstractModuleClient>::get_override
            ((wrapper<AbstractModuleClient> *)&local_20,
             (char *)&this->super_wrapper<AbstractModuleClient>);
  bVar1 = boost::python::api::object_operators::operator_cast_to_function_pointer
                    ((object_operators *)&local_20);
  if (bVar1 != 0) {
    boost::python::override::operator()((override *)&local_10);
    boost::python::handle<_object>::~handle(&local_10);
  }
  boost::python::api::object_base::~object_base(&local_20);
  PyLockGIL::~PyLockGIL(&local_14);
  return;
}

Assistant:

void recv_file_close(){
        PyLockGIL lock;
        if(override recv_file_close = this->get_override("recv_file_close")){
            try{
                recv_file_close();
            }
            catch (const error_already_set&){
                std::cout << "Exception in recv_file_close in application";
                PyErr_Print();
            }
            return;
        }
        AbstractModuleClient::recv_file_close();
    }